

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicCpuInfo.cpp
# Opt level: O3

void __thiscall xmrig::BasicCpuInfo::BasicCpuInfo(BasicCpuInfo *this)

{
  int *piVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char buf [64];
  char local_48 [4];
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  (this->super_ICpuInfo)._vptr_ICpuInfo = (_func_int **)&PTR__ICpuInfo_001ad9e8;
  this->m_brand[0] = '\0';
  this->m_brand[1] = '\0';
  this->m_brand[2] = '\0';
  this->m_brand[3] = '\0';
  this->m_brand[4] = '\0';
  this->m_brand[5] = '\0';
  this->m_brand[6] = '\0';
  this->m_brand[7] = '\0';
  this->m_brand[8] = '\0';
  this->m_brand[9] = '\0';
  this->m_brand[10] = '\0';
  this->m_brand[0xb] = '\0';
  this->m_brand[0xc] = '\0';
  this->m_brand[0xd] = '\0';
  this->m_brand[0xe] = '\0';
  this->m_brand[0xf] = '\0';
  this->m_brand[0x10] = '\0';
  this->m_brand[0x11] = '\0';
  this->m_brand[0x12] = '\0';
  this->m_brand[0x13] = '\0';
  this->m_brand[0x14] = '\0';
  this->m_brand[0x15] = '\0';
  this->m_brand[0x16] = '\0';
  this->m_brand[0x17] = '\0';
  this->m_brand[0x18] = '\0';
  this->m_brand[0x19] = '\0';
  this->m_brand[0x1a] = '\0';
  this->m_brand[0x1b] = '\0';
  this->m_brand[0x1c] = '\0';
  this->m_brand[0x1d] = '\0';
  this->m_brand[0x1e] = '\0';
  this->m_brand[0x1f] = '\0';
  this->m_brand[0x20] = '\0';
  this->m_brand[0x21] = '\0';
  this->m_brand[0x22] = '\0';
  this->m_brand[0x23] = '\0';
  this->m_brand[0x24] = '\0';
  this->m_brand[0x25] = '\0';
  this->m_brand[0x26] = '\0';
  this->m_brand[0x27] = '\0';
  this->m_brand[0x28] = '\0';
  this->m_brand[0x29] = '\0';
  this->m_brand[0x2a] = '\0';
  this->m_brand[0x2b] = '\0';
  this->m_brand[0x2c] = '\0';
  this->m_brand[0x2d] = '\0';
  this->m_brand[0x2e] = '\0';
  this->m_brand[0x2f] = '\0';
  this->m_brand[0x30] = '\0';
  this->m_brand[0x31] = '\0';
  this->m_brand[0x32] = '\0';
  this->m_brand[0x33] = '\0';
  this->m_brand[0x34] = '\0';
  this->m_brand[0x35] = '\0';
  this->m_brand[0x36] = '\0';
  this->m_brand[0x37] = '\0';
  this->m_brand[0x38] = '\0';
  this->m_brand[0x39] = '\0';
  this->m_brand[0x3a] = '\0';
  this->m_brand[0x3b] = '\0';
  this->m_brand[0x3c] = '\0';
  this->m_brand[0x3d] = '\0';
  this->m_brand[0x3e] = '\0';
  this->m_brand[0x3f] = '\0';
  this->m_brand[0x3e] = '\0';
  this->m_brand[0x3f] = '\0';
  this->m_brand[0x40] = '\0';
  this->m_brand[0x41] = '\0';
  this->m_brand[0x42] = '\0';
  this->m_brand[0x43] = '\0';
  this->m_brand[0x44] = '\0';
  this->m_brand[0x45] = '\0';
  uVar7 = std::thread::hardware_concurrency();
  this->m_threads = (ulong)uVar7;
  (this->m_assembly).m_id = NONE;
  lVar12 = 0;
  lVar11 = cpuid_Version_info(1);
  bVar6 = (byte)((uint)*(undefined4 *)(lVar11 + 0xc) >> 0x18);
  this->m_aes = (bool)(bVar6 >> 1 & 1);
  lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
  this->m_avx2 = (bool)(bVar6 >> 3 & (byte)(*(uint *)(lVar11 + 4) >> 5) & 1);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  _local_48 = 0;
  uStack_40 = 0;
  piVar1 = (int *)cpuid_basic_info(0);
  if (3 < *piVar1) {
    iVar10 = -0x7ffffffe;
    do {
      if (iVar10 == 0) {
        puVar2 = (undefined4 *)cpuid_basic_info(0);
      }
      else if (iVar10 == 1) {
        puVar2 = (undefined4 *)cpuid_Version_info(1);
      }
      else if (iVar10 == 2) {
        puVar2 = (undefined4 *)cpuid_cache_tlb_info(2);
      }
      else if (iVar10 == 3) {
        puVar2 = (undefined4 *)cpuid_serial_info(3);
      }
      else if (iVar10 == 4) {
        puVar2 = (undefined4 *)cpuid_Deterministic_Cache_Parameters_info(4);
      }
      else if (iVar10 == 5) {
        puVar2 = (undefined4 *)cpuid_MONITOR_MWAIT_Features_info(5);
      }
      else if (iVar10 == 6) {
        puVar2 = (undefined4 *)cpuid_Thermal_Power_Management_info(6);
      }
      else if (iVar10 == 7) {
        puVar2 = (undefined4 *)cpuid_Extended_Feature_Enumeration_info(7);
      }
      else if (iVar10 == 9) {
        puVar2 = (undefined4 *)cpuid_Direct_Cache_Access_info(9);
      }
      else if (iVar10 == 10) {
        puVar2 = (undefined4 *)cpuid_Architectural_Performance_Monitoring_info(10);
      }
      else if (iVar10 == 0xb) {
        puVar2 = (undefined4 *)cpuid_Extended_Topology_info(0xb);
      }
      else if (iVar10 == 0xd) {
        puVar2 = (undefined4 *)cpuid_Processor_Extended_States_info(0xd);
      }
      else if (iVar10 == 0xf) {
        puVar2 = (undefined4 *)cpuid_Quality_of_Service_info(0xf);
      }
      else if (iVar10 == -0x7ffffffe) {
        puVar2 = (undefined4 *)cpuid_brand_part1_info(0x80000002);
      }
      else if (iVar10 == -0x7ffffffd) {
        puVar2 = (undefined4 *)cpuid_brand_part2_info(0x80000003);
      }
      else if (iVar10 == -0x7ffffffc) {
        puVar2 = (undefined4 *)cpuid_brand_part3_info(0x80000004);
      }
      else {
        puVar2 = (undefined4 *)cpuid(iVar10);
      }
      uVar3 = puVar2[1];
      uVar4 = puVar2[2];
      uVar5 = puVar2[3];
      *(undefined4 *)(local_48 + lVar12) = *puVar2;
      *(undefined4 *)(local_48 + lVar12 + 4) = uVar3;
      *(undefined4 *)((long)&uStack_40 + lVar12) = uVar5;
      *(undefined4 *)((long)&uStack_40 + lVar12 + 4) = uVar4;
      lVar12 = lVar12 + 0x10;
      iVar10 = iVar10 + 1;
    } while (lVar12 != 0x40);
  }
  sVar8 = strlen(local_48);
  if (sVar8 == 0) {
    return;
  }
  sVar9 = 0;
  lVar11 = 0;
  do {
    while (local_48[sVar9] != ' ') {
LAB_00175f3b:
      this->m_brand[lVar11] = local_48[sVar9];
      lVar11 = lVar11 + 1;
LAB_00175f42:
      sVar9 = sVar9 + 1;
      if (sVar9 == sVar8) {
        if (lVar11 == 0) {
          return;
        }
        if (this->m_brand[lVar11 + -1] == ' ') {
          this->m_brand[lVar11 + -1] = '\0';
          return;
        }
        return;
      }
    }
    if (lVar11 != 0) {
      if (this->m_brand[lVar11 + -1] != ' ') goto LAB_00175f3b;
      goto LAB_00175f42;
    }
    sVar9 = sVar9 + 1;
    lVar11 = 0;
    if (sVar9 == sVar8) {
      return;
    }
  } while( true );
}

Assistant:

xmrig::BasicCpuInfo::BasicCpuInfo() :
    m_brand(),
    m_threads(std::thread::hardware_concurrency()),
    m_assembly(Assembly::NONE),
    m_aes(has_aes_ni()),
    m_avx2(has_avx2())
{
    cpu_brand_string(m_brand);
}